

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrent_queue.hpp
# Opt level: O1

void __thiscall
concurrent_queue<oqpi::task_handle>::push(concurrent_queue<oqpi::task_handle> *this,task_handle *t)

{
  int iVar1;
  undefined8 uVar2;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar1 == 0) {
    std::deque<oqpi::task_handle,std::allocator<oqpi::task_handle>>::
    emplace_back<oqpi::task_handle_const&>
              ((deque<oqpi::task_handle,std::allocator<oqpi::task_handle>> *)&this->queue_,t);
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return;
  }
  uVar2 = std::__throw_system_error(iVar1);
  pthread_mutex_unlock((pthread_mutex_t *)this);
  _Unwind_Resume(uVar2);
}

Assistant:

void push(const T &t)
    {
        lock_t __l(mutex_);
        queue_.emplace(t);
    }